

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

State * __thiscall re2::DFA::RunStateOnByte(DFA *this,State *state,int c)

{
  State *pSVar1;
  int iVar2;
  ostream *poVar3;
  bool local_519;
  uint local_4d8;
  bool local_4d3;
  bool local_4d2;
  byte local_4d1;
  uint flag;
  bool ismatch;
  bool isword;
  uint uStack_4cc;
  bool islastword;
  uint afterflag;
  uint oldbeforeflag;
  uint beforeflag;
  uint needflag;
  State *ns;
  LogMessage local_338;
  LogMessage local_1a8;
  int local_24;
  State *pSStack_20;
  int c_local;
  State *state_local;
  DFA *this_local;
  
  local_24 = c;
  pSStack_20 = state;
  state_local = (State *)this;
  Mutex::AssertHeld(&this->mutex_);
  pSVar1 = pSStack_20;
  if (pSStack_20 < (State *)0x3) {
    if (pSStack_20 == (State *)0x2) {
      this_local = (DFA *)0x2;
    }
    else if (pSStack_20 == (State *)0x1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",0x3d8
                );
      poVar3 = LogMessage::stream(&local_1a8);
      std::operator<<(poVar3,"DeadState in RunStateOnByte");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a8);
      this_local = (DFA *)0x0;
    }
    else if (pSStack_20 == (State *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_338,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",0x3dc
                );
      poVar3 = LogMessage::stream(&local_338);
      std::operator<<(poVar3,"NULL state in RunStateOnByte");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_338);
      this_local = (DFA *)0x0;
    }
    else {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&ns,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",0x3df
                );
      poVar3 = LogMessage::stream((LogMessage *)&ns);
      std::operator<<(poVar3,"Unexpected special state in RunStateOnByte");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&ns);
      this_local = (DFA *)0x0;
    }
  }
  else {
    iVar2 = ByteMap(this,local_24);
    _beforeflag = (DFA *)std::atomic<re2::DFA::State_*>::load
                                   ((atomic<re2::DFA::State_*> *)(&pSVar1[1].inst_ + iVar2),
                                    memory_order_relaxed);
    this_local = _beforeflag;
    if (_beforeflag == (DFA *)0x0) {
      StateToWorkq(this,pSStack_20,this->q0_);
      oldbeforeflag = pSStack_20->flag_ >> 0x10;
      uStack_4cc = pSStack_20->flag_ & 0xfff;
      afterflag = uStack_4cc;
      if (local_24 == 10) {
        afterflag = uStack_4cc | 2;
      }
      flag = (uint)(local_24 == 10);
      if (local_24 == 0x100) {
        afterflag = afterflag | 10;
      }
      local_4d1 = (pSStack_20->flag_ & 0x2000) != 0;
      local_519 = false;
      if (local_24 != 0x100) {
        local_519 = Prog::IsWordChar((uint8)local_24);
      }
      local_4d2 = local_519;
      if (local_519 == (bool)(local_4d1 & 1)) {
        afterflag = afterflag | 0x20;
      }
      else {
        afterflag = afterflag | 0x10;
      }
      if ((afterflag & (uStack_4cc ^ 0xffffffff) & oldbeforeflag) != 0) {
        RunWorkqOnEmptyString(this,this->q0_,this->q1_,afterflag);
        std::swap<re2::DFA::Workq*>(&this->q0_,&this->q1_);
      }
      local_4d3 = false;
      RunWorkqOnByte(this,this->q0_,this->q1_,local_24,flag,&local_4d3,this->kind_);
      if ((local_24 != 0x100) || (this->kind_ != kManyMatch)) {
        std::swap<re2::DFA::Workq*>(&this->q0_,&this->q1_);
      }
      local_4d8 = flag;
      if ((local_4d3 & 1U) != 0) {
        local_4d8 = flag | 0x1000;
      }
      if ((local_4d2 & 1U) != 0) {
        local_4d8 = local_4d8 | 0x2000;
      }
      _beforeflag = (DFA *)WorkqToCachedState(this,this->q0_,local_4d8);
      pSVar1 = pSStack_20;
      iVar2 = ByteMap(this,local_24);
      std::atomic<re2::DFA::State_*>::store
                ((atomic<re2::DFA::State_*> *)(&pSVar1[1].inst_ + iVar2),(__pointer_type)_beforeflag
                 ,memory_order_release);
      this_local = _beforeflag;
    }
  }
  return (State *)this_local;
}

Assistant:

DFA::State* DFA::RunStateOnByte(State* state, int c) {
  if (DEBUG_MODE)
    mutex_.AssertHeld();
  if (state <= SpecialStateMax) {
    if (state == FullMatchState) {
      // It is convenient for routines like PossibleMatchRange
      // if we implement RunStateOnByte for FullMatchState:
      // once you get into this state you never get out,
      // so it's pretty easy.
      return FullMatchState;
    }
    if (state == DeadState) {
      LOG(DFATAL) << "DeadState in RunStateOnByte";
      return NULL;
    }
    if (state == NULL) {
      LOG(DFATAL) << "NULL state in RunStateOnByte";
      return NULL;
    }
    LOG(DFATAL) << "Unexpected special state in RunStateOnByte";
    return NULL;
  }

  // If someone else already computed this, return it.
  State* ns = state->next_[ByteMap(c)].load(std::memory_order_relaxed);
  if (ns != NULL)
    return ns;

  // Convert state into Workq.
  StateToWorkq(state, q0_);

  // Flags marking the kinds of empty-width things (^ $ etc)
  // around this byte.  Before the byte we have the flags recorded
  // in the State structure itself.  After the byte we have
  // nothing yet (but that will change: read on).
  uint needflag = state->flag_ >> kFlagNeedShift;
  uint beforeflag = state->flag_ & kFlagEmptyMask;
  uint oldbeforeflag = beforeflag;
  uint afterflag = 0;

  if (c == '\n') {
    // Insert implicit $ and ^ around \n
    beforeflag |= kEmptyEndLine;
    afterflag |= kEmptyBeginLine;
  }

  if (c == kByteEndText) {
    // Insert implicit $ and \z before the fake "end text" byte.
    beforeflag |= kEmptyEndLine | kEmptyEndText;
  }

  // The state flag kFlagLastWord says whether the last
  // byte processed was a word character.  Use that info to
  // insert empty-width (non-)word boundaries.
  bool islastword = (state->flag_ & kFlagLastWord) != 0;
  bool isword = (c != kByteEndText && Prog::IsWordChar(static_cast<uint8>(c)));
  if (isword == islastword)
    beforeflag |= kEmptyNonWordBoundary;
  else
    beforeflag |= kEmptyWordBoundary;

  // Okay, finally ready to run.
  // Only useful to rerun on empty string if there are new, useful flags.
  if (beforeflag & ~oldbeforeflag & needflag) {
    RunWorkqOnEmptyString(q0_, q1_, beforeflag);
    swap(q0_, q1_);
  }
  bool ismatch = false;
  RunWorkqOnByte(q0_, q1_, c, afterflag, &ismatch, kind_);

  // Most of the time, we build the state from the output of
  // RunWorkqOnByte, so swap q0_ and q1_ here.  However, so that
  // RE2::Set can tell exactly which match instructions
  // contributed to the match, don't swap if c is kByteEndText.
  // The resulting state wouldn't be correct for further processing
  // of the string, but we're at the end of the text so that's okay.
  // Leaving q0_ alone preseves the match instructions that led to
  // the current setting of ismatch.
  if (c != kByteEndText || kind_ != Prog::kManyMatch)
    swap(q0_, q1_);

  // Save afterflag along with ismatch and isword in new state.
  uint flag = afterflag;
  if (ismatch)
    flag |= kFlagMatch;
  if (isword)
    flag |= kFlagLastWord;

  ns = WorkqToCachedState(q0_, flag);

  // Flush ns before linking to it.
  // Write barrier before updating state->next_ so that the
  // main search loop can proceed without any locking, for speed.
  // (Otherwise it would need one mutex operation per input byte.)
  state->next_[ByteMap(c)].store(ns, std::memory_order_release);
  return ns;
}